

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of,int32_t pdgcode)

{
  mcpl_outfile_t of_00;
  int in_ESI;
  long in_RDI;
  mcpl_outfileinternal_t *f;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    mcpl_error((char *)0x1033c9);
  }
  if (*(int *)(in_RDI + 0x54) == 0) {
    if (*(int *)(in_RDI + 0x60) == 0) {
      mcpl_error((char *)0x103404);
    }
    *(int *)(in_RDI + 0x54) = in_ESI;
    of_00.internal._4_4_ = in_ESI;
    of_00.internal._0_4_ = in_stack_fffffffffffffff0;
    mcpl_recalc_psize(of_00);
  }
  else if (*(int *)(in_RDI + 0x54) != in_ESI) {
    mcpl_error((char *)0x1033ec);
  }
  return;
}

Assistant:

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of, int32_t pdgcode)
{
  MCPLIMP_OUTFILEDECODE;
  if (pdgcode==0)
    mcpl_error("mcpl_enable_universal_pdgcode must be called with non-zero pdgcode.");
  if (f->opt_universalpdgcode) {
    if (f->opt_universalpdgcode!=pdgcode)
      mcpl_error("mcpl_enable_universal_pdgcode called multiple times");
    return;
  }
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_universal_pdgcode called too late.");
  f->opt_universalpdgcode = pdgcode;
  mcpl_recalc_psize(of);
}